

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O2

void __thiscall features::Sift::descriptor_generation(Sift *this)

{
  Keypoint *kp;
  pointer pKVar1;
  pointer pKVar2;
  pointer pDVar3;
  double dVar4;
  bool bVar5;
  ulong uVar6;
  runtime_error *this_00;
  Sift *this_01;
  Octave *octave;
  uint uVar7;
  size_t j;
  undefined1 local_270 [8];
  Descriptor desc;
  undefined1 auStack_58 [8];
  vector<float,_std::allocator<float>_> orientations;
  element_type *local_38;
  
  if ((this->octaves).
      super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->octaves).
      super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Octaves not available!");
LAB_00114835:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pKVar1 = (this->keypoints).
           super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->keypoints).
           super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pKVar1 != pKVar2) {
    this_01 = (Sift *)&this->descriptors;
    pDVar3 = (this->descriptors).
             super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->descriptors).
        super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
        _M_impl.super__Vector_impl_data._M_finish != pDVar3) {
      (this->descriptors).
      super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_finish = pDVar3;
    }
    uVar6 = (long)pKVar2 - (long)pKVar1 >> 4;
    orientations.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)this_01;
    std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::reserve
              ((vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_> *)
               this_01,(uVar6 >> 1) + uVar6);
    local_38 = (element_type *)
               (long)((this->keypoints).
                      super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>
                      ._M_impl.super__Vector_impl_data._M_start)->octave;
    octave = (this->octaves).
             super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>.
             _M_impl.super__Vector_impl_data._M_start +
             ((long)local_38 - (long)(this->options).min_octave);
    generate_grad_ori_images(this_01,octave);
    for (desc.data.v._504_8_ = 0;
        pKVar1 = (this->keypoints).
                 super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        (ulong)desc.data.v._504_8_ <
        (ulong)((long)(this->keypoints).
                      super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar1 >> 4);
        desc.data.v._504_8_ = desc.data.v._504_8_ + 1) {
      kp = pKVar1 + desc.data.v._504_8_;
      uVar7 = pKVar1[desc.data.v._504_8_].octave;
      if ((int)local_38 < (int)uVar7) {
        if (octave != (Octave *)0x0) {
          std::
          vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
          ::clear(&octave->grad);
          this_01 = (Sift *)&octave->ori;
          std::
          vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
          ::clear((vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                   *)this_01);
          uVar7 = kp->octave;
        }
        octave = (this->octaves).
                 super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 ((long)(int)uVar7 - (long)(this->options).min_octave);
        generate_grad_ori_images(this_01,octave);
        local_38 = (element_type *)(ulong)uVar7;
      }
      else if ((int)uVar7 < (int)local_38) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Decreasing octave index!");
        goto LAB_00114835;
      }
      auStack_58 = (undefined1  [8])0x0;
      orientations.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      orientations.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      std::vector<float,_std::allocator<float>_>::reserve
                ((vector<float,_std::allocator<float>_> *)auStack_58,8);
      orientation_assignment(this,kp,octave,(vector<float,_std::allocator<float>_> *)auStack_58);
      for (uVar6 = 0;
          uVar6 < (ulong)((long)orientations.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 2);
          uVar6 = uVar6 + 1) {
        dVar4 = ldexp(1.0,kp->octave);
        local_270._0_4_ = (kp->x + 0.5) * (float)dVar4 + -0.5;
        local_270._4_4_ = (kp->y + 0.5) * (float)dVar4 + -0.5;
        desc.x = keypoint_absolute_scale(this,kp);
        desc.y = *(float *)((long)auStack_58 + uVar6 * 4);
        bVar5 = descriptor_assignment(this,kp,(value_type *)local_270,octave);
        if (bVar5) {
          std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::
          push_back((vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                     *)orientations.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(value_type *)local_270);
        }
      }
      this_01 = (Sift *)auStack_58;
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)this_01);
    }
  }
  return;
}

Assistant:

void
Sift::descriptor_generation (void)
{
    if (this->octaves.empty())
        throw std::runtime_error("Octaves not available!");
    if (this->keypoints.empty())
        return;

    this->descriptors.clear();
    this->descriptors.reserve(this->keypoints.size() * 3 / 2);

    /*
     * Keep a buffer of S+3 gradient and orientation images for the current
     * octave. Once the octave is changed, these images are recomputed.
     * To ensure efficiency, the octave index must always increase, never
     * decrease, which is enforced during the algorithm.
     */
    int octave_index = this->keypoints[0].octave;
    Octave* octave = &this->octaves[octave_index - this->options.min_octave];
    this->generate_grad_ori_images(octave);

    /* Walk over all keypoints and compute descriptors. */
    for (std::size_t i = 0; i < this->keypoints.size(); ++i)
    {
        Keypoint const& kp(this->keypoints[i]);

        /* Generate new gradient and orientation images if octave changed. */
        if (kp.octave > octave_index)
        {
            /* Clear old octave gradient and orientation images. */
            if (octave)
            {
                octave->grad.clear();
                octave->ori.clear();
            }
            /* Setup new octave gradient and orientation images. */
            octave_index = kp.octave;
            octave = &this->octaves[octave_index - this->options.min_octave];
            this->generate_grad_ori_images(octave);
        }
        else if (kp.octave < octave_index)
        {
            throw std::runtime_error("Decreasing octave index!");
        }

        /* Orientation assignment. This returns multiple orientations. */
        std::vector<float> orientations;
        orientations.reserve(8);
        this->orientation_assignment(kp, octave, orientations);

        /* Feature vector extraction. */
        for (std::size_t j = 0; j < orientations.size(); ++j)
        {
            Descriptor desc;
            float const scale_factor = std::pow(2.0f, kp.octave);
            desc.x = scale_factor * (kp.x + 0.5f) - 0.5f;
            desc.y = scale_factor * (kp.y + 0.5f) - 0.5f;
            desc.scale = this->keypoint_absolute_scale(kp);
            desc.orientation = orientations[j];
            if (this->descriptor_assignment(kp, desc, octave))
                this->descriptors.push_back(desc);
        }
    }
}